

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_ssse3_intr.c
# Opt level: O1

void ihevc_deblk_luma_horz_ssse3
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 bs,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 beta_offset_div2,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  unkuint10 Var11;
  unkbyte10 Var12;
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  unkbyte10 Var15;
  int iVar16;
  UWORD8 *pUVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  char cVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  long lVar26;
  undefined8 uVar27;
  undefined1 in_XMM0 [16];
  undefined1 uVar28;
  undefined1 uVar36;
  undefined8 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 in_XMM1 [16];
  undefined1 uVar37;
  byte bVar38;
  byte bVar45;
  byte bVar47;
  byte bVar49;
  undefined4 uVar39;
  undefined1 uVar44;
  undefined1 uVar46;
  undefined1 uVar50;
  byte bVar51;
  undefined1 uVar52;
  byte bVar53;
  undefined1 uVar54;
  byte bVar55;
  undefined1 uVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  undefined1 in_XMM2 [16];
  undefined1 uVar48;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  byte bVar65;
  undefined4 uVar66;
  undefined1 in_XMM3 [16];
  undefined1 auVar68 [16];
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  undefined1 in_XMM4 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  short sVar78;
  short sVar89;
  byte bVar90;
  short sVar91;
  byte bVar93;
  short sVar94;
  short sVar96;
  short sVar97;
  short sVar98;
  undefined1 in_XMM5 [16];
  byte bVar92;
  byte bVar95;
  undefined1 auVar79 [16];
  undefined1 auVar88 [16];
  short sVar99;
  short sVar100;
  short sVar117;
  short sVar118;
  undefined8 in_XMM6_Qa;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  short sVar123;
  ushort uVar124;
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  undefined1 in_XMM7 [16];
  undefined1 auVar125 [16];
  ushort uVar133;
  undefined1 auVar126 [16];
  short sVar134;
  short sVar135;
  int iVar136;
  undefined1 uVar183;
  undefined1 uVar187;
  short sVar188;
  int iVar190;
  undefined1 uVar192;
  short sVar196;
  short sVar198;
  short sVar200;
  undefined1 auVar137 [16];
  undefined1 auVar144 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 uVar182;
  undefined1 uVar186;
  undefined1 uVar191;
  undefined1 uVar195;
  undefined1 auVar154 [16];
  undefined1 auVar163 [16];
  undefined1 auVar172 [16];
  short sVar184;
  short sVar185;
  short sVar189;
  short sVar193;
  short sVar194;
  short sVar197;
  short sVar199;
  short sVar201;
  short sVar202;
  short sVar203;
  undefined1 auVar173 [16];
  undefined2 uVar279;
  undefined1 uVar230;
  undefined1 uVar231;
  undefined1 uVar232;
  undefined1 uVar233;
  undefined1 uVar234;
  undefined1 uVar235;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 uVar229;
  undefined1 auVar216 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar236 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar256 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined1 auVar40 [12];
  undefined1 auVar43 [16];
  undefined1 auVar67 [12];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar112 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar113 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar114 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar155 [16];
  undefined1 auVar164 [16];
  undefined1 auVar174 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar156 [16];
  undefined1 auVar165 [16];
  undefined1 auVar175 [16];
  undefined1 auVar157 [16];
  undefined1 auVar166 [16];
  undefined1 auVar176 [16];
  undefined1 auVar158 [16];
  undefined1 auVar167 [16];
  undefined1 auVar177 [16];
  undefined1 auVar159 [16];
  undefined1 auVar168 [16];
  undefined1 auVar178 [16];
  undefined1 auVar160 [16];
  undefined1 auVar169 [16];
  undefined1 auVar179 [16];
  undefined1 auVar161 [16];
  undefined1 auVar170 [16];
  undefined1 auVar180 [16];
  undefined1 auVar162 [16];
  undefined1 auVar171 [16];
  undefined1 auVar181 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar204 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar248 [16];
  undefined1 auVar257 [16];
  undefined1 auVar267 [16];
  undefined1 auVar249 [16];
  undefined1 auVar258 [16];
  undefined1 auVar268 [16];
  undefined1 auVar250 [16];
  undefined1 auVar259 [16];
  undefined1 auVar269 [16];
  undefined1 auVar251 [16];
  undefined1 auVar260 [16];
  undefined1 auVar270 [16];
  undefined1 auVar252 [16];
  undefined1 auVar261 [16];
  undefined1 auVar271 [16];
  undefined1 auVar253 [16];
  undefined1 auVar262 [16];
  undefined1 auVar272 [16];
  undefined1 auVar254 [16];
  undefined1 auVar263 [16];
  undefined1 auVar273 [16];
  undefined1 auVar255 [16];
  undefined1 auVar264 [16];
  undefined1 auVar274 [16];
  
  if (bs < 1) {
    __assert_fail("((bs > 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_deblk_ssse3_intr.c"
                  ,0x235,
                  "void ihevc_deblk_luma_horz_ssse3(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if (filter_flag_q != 0 || filter_flag_p != 0) {
    iVar16 = quant_param_p + quant_param_q + 1 >> 1;
    uVar18 = iVar16 + beta_offset_div2 * 2;
    cVar21 = '\0';
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    uVar24 = 0x33;
    if ((int)uVar18 < 0x33) {
      uVar24 = (ulong)uVar18;
    }
    uVar18 = (bs & 0x7ffffffeU) + iVar16 + tc_offset_div2 * 2;
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    uVar19 = 0x35;
    if ((int)uVar18 < 0x35) {
      uVar19 = (ulong)uVar18;
    }
    iVar16 = gai4_ihevc_tc_table[uVar19];
    if (iVar16 == 0) {
      uVar18 = 0;
      uVar23 = 0;
    }
    else {
      lVar26 = (long)src_strd;
      uVar19 = *(ulong *)(pu1_src + -lVar26);
      in_XMM1._8_8_ = 0;
      in_XMM1._0_8_ = uVar19;
      uVar1 = *(ulong *)(pu1_src + lVar26 * -2);
      in_XMM0._8_8_ = 0;
      in_XMM0._0_8_ = uVar1;
      in_XMM6_Qa = *(undefined8 *)(pu1_src + lVar26 * 3);
      uVar2 = *(ulong *)pu1_src;
      in_XMM3._8_8_ = 0;
      in_XMM3._0_8_ = uVar2;
      uVar3 = *(ulong *)(pu1_src + lVar26);
      in_XMM2._8_8_ = 0;
      in_XMM2._0_8_ = uVar3;
      uVar4 = *(ulong *)(pu1_src + lVar26 * 2);
      in_XMM5._8_8_ = 0;
      in_XMM5._0_8_ = uVar4;
      uVar5 = *(ulong *)(pu1_src + lVar26 * -3);
      in_XMM4._8_8_ = 0;
      in_XMM4._0_8_ = uVar5;
      uVar6 = *(ulong *)(pu1_src + -(long)(src_strd << 2));
      in_XMM7._8_8_ = 0;
      in_XMM7._0_8_ = uVar6;
      auVar143._8_6_ = 0;
      auVar143._0_8_ = uVar1;
      auVar143[0xe] = (char)(uVar1 >> 0x38);
      auVar143[0xf] = (char)(uVar19 >> 0x38);
      auVar142._14_2_ = auVar143._14_2_;
      auVar142._8_5_ = 0;
      auVar142._0_8_ = uVar1;
      auVar142[0xd] = (char)(uVar19 >> 0x30);
      auVar141._13_3_ = auVar142._13_3_;
      auVar141._8_4_ = 0;
      auVar141._0_8_ = uVar1;
      auVar141[0xc] = (char)(uVar1 >> 0x30);
      auVar140._12_4_ = auVar141._12_4_;
      auVar140._8_3_ = 0;
      auVar140._0_8_ = uVar1;
      auVar140[0xb] = (char)(uVar19 >> 0x28);
      auVar139._11_5_ = auVar140._11_5_;
      auVar139._8_2_ = 0;
      auVar139._0_8_ = uVar1;
      auVar139[10] = (char)(uVar1 >> 0x28);
      auVar138._10_6_ = auVar139._10_6_;
      auVar138[8] = 0;
      auVar138._0_8_ = uVar1;
      auVar138[9] = (char)(uVar19 >> 0x20);
      auVar137._9_7_ = auVar138._9_7_;
      auVar137[8] = (char)(uVar1 >> 0x20);
      auVar137._0_8_ = uVar1;
      auVar211._8_6_ = 0;
      auVar211._0_8_ = uVar6;
      auVar211[0xe] = (char)(uVar6 >> 0x38);
      auVar211[0xf] = (char)(uVar5 >> 0x38);
      auVar210._14_2_ = auVar211._14_2_;
      auVar210._8_5_ = 0;
      auVar210._0_8_ = uVar6;
      auVar210[0xd] = (char)(uVar5 >> 0x30);
      auVar209._13_3_ = auVar210._13_3_;
      auVar209._8_4_ = 0;
      auVar209._0_8_ = uVar6;
      auVar209[0xc] = (char)(uVar6 >> 0x30);
      auVar208._12_4_ = auVar209._12_4_;
      auVar208._8_3_ = 0;
      auVar208._0_8_ = uVar6;
      auVar208[0xb] = (char)(uVar5 >> 0x28);
      auVar207._11_5_ = auVar208._11_5_;
      auVar207._8_2_ = 0;
      auVar207._0_8_ = uVar6;
      auVar207[10] = (char)(uVar6 >> 0x28);
      auVar206._10_6_ = auVar207._10_6_;
      auVar206[8] = 0;
      auVar206._0_8_ = uVar6;
      auVar206[9] = (char)(uVar5 >> 0x20);
      auVar205._9_7_ = auVar206._9_7_;
      auVar205[8] = (char)(uVar6 >> 0x20);
      auVar205._0_8_ = uVar6;
      Var11 = CONCAT91(CONCAT81(auVar205._8_8_,(char)(uVar5 >> 0x18)),(char)(uVar6 >> 0x18));
      auVar101._10_6_ = 0;
      auVar101._0_10_ = Var11;
      auVar215._11_5_ = 0;
      auVar215._0_11_ = SUB1611(auVar101 << 0x30,5);
      auVar244._12_4_ = 0;
      auVar244._0_12_ = SUB1612(auVar215 << 0x28,4);
      auVar153._13_3_ = 0;
      auVar153._0_13_ = SUB1613(auVar244 << 0x20,3);
      auVar204._2_14_ = SUB1614(auVar153 << 0x18,2);
      uVar279 = CONCAT11((char)uVar5,(char)uVar6);
      auVar212._0_12_ = auVar204._0_12_;
      auVar212._12_2_ = (short)Var11;
      auVar212._14_2_ =
           (short)CONCAT91(CONCAT81(auVar137._8_8_,(char)(uVar19 >> 0x18)),(char)(uVar1 >> 0x18));
      auVar213._0_4_ = CONCAT22(CONCAT11((char)uVar19,(char)uVar1),uVar279);
      auVar151._8_6_ = 0;
      auVar151._0_8_ = uVar2;
      auVar151[0xe] = (char)(uVar2 >> 0x38);
      auVar151[0xf] = (char)(uVar3 >> 0x38);
      auVar150._14_2_ = auVar151._14_2_;
      auVar150._8_5_ = 0;
      auVar150._0_8_ = uVar2;
      auVar150[0xd] = (char)(uVar3 >> 0x30);
      auVar149._13_3_ = auVar150._13_3_;
      auVar149._8_4_ = 0;
      auVar149._0_8_ = uVar2;
      auVar149[0xc] = (char)(uVar2 >> 0x30);
      auVar148._12_4_ = auVar149._12_4_;
      auVar148._8_3_ = 0;
      auVar148._0_8_ = uVar2;
      auVar148[0xb] = (char)(uVar3 >> 0x28);
      auVar147._11_5_ = auVar148._11_5_;
      auVar147._8_2_ = 0;
      auVar147._0_8_ = uVar2;
      auVar147[10] = (char)(uVar2 >> 0x28);
      auVar146._10_6_ = auVar147._10_6_;
      auVar146[8] = 0;
      auVar146._0_8_ = uVar2;
      auVar146[9] = (char)(uVar3 >> 0x20);
      auVar145._9_7_ = auVar146._9_7_;
      auVar145[8] = (char)(uVar2 >> 0x20);
      auVar145._0_8_ = uVar2;
      Var11 = CONCAT91(CONCAT81(auVar145._8_8_,(char)(uVar3 >> 0x18)),(char)(uVar2 >> 0x18));
      auVar276._10_6_ = 0;
      auVar276._0_10_ = Var11;
      auVar245._11_5_ = 0;
      auVar245._0_11_ = SUB1611(auVar276 << 0x30,5);
      auVar226._12_4_ = 0;
      auVar226._0_12_ = SUB1612(auVar245 << 0x28,4);
      auVar125._13_3_ = 0;
      auVar125._0_13_ = SUB1613(auVar226 << 0x20,3);
      auVar144._2_14_ = SUB1614(auVar125 << 0x18,2);
      auVar144._0_2_ = CONCAT11((char)uVar3,(char)uVar2);
      auVar243._8_6_ = 0;
      auVar243._0_8_ = uVar4;
      auVar243[0xe] = (char)(uVar4 >> 0x38);
      auVar243[0xf] = (char)((ulong)in_XMM6_Qa >> 0x38);
      auVar242._14_2_ = auVar243._14_2_;
      auVar242._8_5_ = 0;
      auVar242._0_8_ = uVar4;
      auVar242[0xd] = (char)((ulong)in_XMM6_Qa >> 0x30);
      auVar241._13_3_ = auVar242._13_3_;
      auVar241._8_4_ = 0;
      auVar241._0_8_ = uVar4;
      auVar241[0xc] = (char)(uVar4 >> 0x30);
      auVar240._12_4_ = auVar241._12_4_;
      auVar240._8_3_ = 0;
      auVar240._0_8_ = uVar4;
      auVar240[0xb] = (char)((ulong)in_XMM6_Qa >> 0x28);
      auVar239._11_5_ = auVar240._11_5_;
      auVar239._8_2_ = 0;
      auVar239._0_8_ = uVar4;
      auVar239[10] = (char)(uVar4 >> 0x28);
      auVar238._10_6_ = auVar239._10_6_;
      auVar238[8] = 0;
      auVar238._0_8_ = uVar4;
      auVar238[9] = (char)((ulong)in_XMM6_Qa >> 0x20);
      auVar237._9_7_ = auVar238._9_7_;
      auVar237[8] = (char)(uVar4 >> 0x20);
      auVar237._0_8_ = uVar4;
      Var12 = CONCAT91(CONCAT81(auVar237._8_8_,(char)((ulong)in_XMM6_Qa >> 0x18)),
                       (char)(uVar4 >> 0x18));
      auVar236._6_10_ = Var12;
      auVar236[5] = (char)((ulong)in_XMM6_Qa >> 0x10);
      auVar236[4] = (char)(uVar4 >> 0x10);
      auVar236[3] = (char)((ulong)in_XMM6_Qa >> 8);
      auVar236[2] = (char)(uVar4 >> 8);
      auVar236._0_2_ = CONCAT11((char)in_XMM6_Qa,(char)uVar4);
      auVar152._0_12_ = auVar144._0_12_;
      auVar152._12_2_ = (short)Var11;
      auVar152._14_2_ = (short)Var12;
      auVar213._6_2_ = auVar236._0_2_;
      auVar213._4_2_ = auVar144._0_2_;
      auVar214._4_4_ = auVar212._12_4_;
      auVar214._0_4_ = auVar213._0_4_;
      auVar214._8_4_ = auVar212._12_4_;
      auVar214._12_4_ = auVar152._12_4_;
      auVar213._8_8_ = auVar214._8_8_;
      auVar153 = pmaddubsw(auVar213,(undefined1  [16])coef_d);
      iVar22 = gai4_ihevc_beta_table[uVar24];
      auVar244 = pmovsxbw(auVar236,0x101010101010101);
      auVar153 = pmaddwd(auVar153,auVar244);
      auVar153 = pabsd(auVar153,auVar153);
      iVar136 = auVar153._4_4_ + auVar153._0_4_;
      iVar190 = auVar153._8_4_ + auVar153._12_4_;
      if (iVar190 + iVar136 < iVar22) {
        auVar215 = pshufb(auVar213,(undefined1  [16])shuffle_d);
        auVar215 = pmaddubsw(auVar215,_DAT_00172650);
        auVar215 = pabsw(auVar215,auVar215);
        auVar244 = pmaddwd(auVar215,auVar244);
        bVar20 = false;
        bVar25 = false;
        if ((iVar136 * 2 < iVar22 >> 2) && (auVar244._8_4_ < iVar22 >> 3)) {
          bVar25 = auVar244._0_4_ < iVar16 * 5 + 1 >> 1;
        }
        if ((iVar190 * 2 < iVar22 >> 2) && (auVar244._12_4_ < iVar22 >> 3)) {
          bVar20 = auVar244._4_4_ < iVar16 * 5 + 1 >> 1;
        }
        iVar22 = (iVar22 >> 1) + iVar22 >> 3;
        uVar18 = (uint)(auVar153._4_4_ + auVar153._12_4_ < iVar22 && 1 < iVar16);
        uVar23 = (uint)(auVar153._0_4_ + auVar153._8_4_ < iVar22 && 1 < iVar16);
        cVar21 = (bVar20 & bVar25) + 1;
      }
      else {
        uVar18 = 0;
        uVar23 = 0;
        cVar21 = '\0';
      }
    }
    if ((iVar16 != 0) && (cVar21 != '\0')) {
      uVar28 = in_XMM1[0];
      uVar30 = in_XMM1[1];
      uVar31 = in_XMM1[2];
      uVar32 = in_XMM1[3];
      uVar33 = in_XMM1[4];
      uVar34 = in_XMM1[5];
      uVar35 = in_XMM1[6];
      uVar36 = in_XMM1[7];
      uVar37 = in_XMM2[0];
      uVar44 = in_XMM2[1];
      uVar46 = in_XMM2[2];
      uVar48 = in_XMM2[3];
      uVar50 = in_XMM2[4];
      uVar52 = in_XMM2[5];
      uVar54 = in_XMM2[6];
      uVar56 = in_XMM2[7];
      uVar235 = in_XMM0[7];
      auVar224._0_14_ = in_XMM0._0_14_;
      uVar195 = in_XMM3[7];
      auVar162._0_14_ = in_XMM3._0_14_;
      auVar161._0_13_ = in_XMM3._0_13_;
      uVar234 = in_XMM0[6];
      auVar222._0_12_ = in_XMM0._0_12_;
      auVar159._0_11_ = in_XMM3._0_11_;
      auVar223._0_13_ = in_XMM0._0_13_;
      uVar192 = in_XMM3[6];
      auVar160._0_12_ = in_XMM3._0_12_;
      uVar233 = in_XMM0[5];
      auVar220._0_10_ = in_XMM0._0_10_;
      auVar218._0_8_ = in_XMM0._0_8_;
      auVar221._0_11_ = in_XMM0._0_11_;
      uVar191 = in_XMM3[5];
      auVar158._0_10_ = in_XMM3._0_10_;
      auVar156._0_8_ = in_XMM3._0_8_;
      auVar157._0_9_ = in_XMM3._0_9_;
      uVar231 = in_XMM0[3];
      uVar230 = in_XMM0[2];
      auVar217._0_4_ = in_XMM0._0_4_;
      uVar183 = in_XMM3[2];
      uVar186 = in_XMM3[3];
      auVar155._0_4_ = in_XMM3._0_4_;
      uVar232 = in_XMM0[4];
      auVar219._0_9_ = in_XMM0._0_9_;
      uVar187 = in_XMM3[4];
      uVar182 = in_XMM3[1];
      auVar154[0] = in_XMM3[0];
      uVar229 = in_XMM0[1];
      auVar216[0] = in_XMM0[0];
      if (cVar21 == '\x02') {
        auVar224[0xe] = uVar235;
        auVar224[0xf] = uVar36;
        auVar223._14_2_ = auVar224._14_2_;
        auVar223[0xd] = uVar35;
        auVar222._13_3_ = auVar223._13_3_;
        auVar222[0xc] = uVar234;
        auVar221._12_4_ = auVar222._12_4_;
        auVar221[0xb] = uVar34;
        auVar220._11_5_ = auVar221._11_5_;
        auVar220[10] = uVar233;
        auVar219._10_6_ = auVar220._10_6_;
        auVar219[9] = uVar33;
        auVar218._9_7_ = auVar219._9_7_;
        auVar218[8] = uVar232;
        auVar217._8_8_ = auVar218._8_8_;
        auVar217[7] = uVar32;
        auVar217[6] = uVar231;
        auVar217[5] = uVar31;
        auVar217[4] = uVar230;
        auVar216._4_12_ = auVar217._4_12_;
        auVar216[3] = uVar30;
        auVar216[2] = uVar229;
        auVar216[1] = uVar28;
        auVar162[0xe] = uVar195;
        auVar162[0xf] = uVar56;
        auVar161._14_2_ = auVar162._14_2_;
        auVar161[0xd] = uVar54;
        auVar160._13_3_ = auVar161._13_3_;
        auVar160[0xc] = uVar192;
        auVar159._12_4_ = auVar160._12_4_;
        auVar159[0xb] = uVar52;
        auVar158._11_5_ = auVar159._11_5_;
        auVar158[10] = uVar191;
        auVar157._10_6_ = auVar158._10_6_;
        auVar157[9] = uVar50;
        auVar156._9_7_ = auVar157._9_7_;
        auVar156[8] = uVar187;
        auVar155._8_8_ = auVar156._8_8_;
        auVar155[7] = uVar48;
        auVar155[6] = uVar186;
        auVar155[5] = uVar46;
        auVar155[4] = uVar183;
        auVar154._4_12_ = auVar155._4_12_;
        auVar154[3] = uVar44;
        auVar154[2] = uVar182;
        auVar154[1] = uVar37;
        auVar225._0_8_ = auVar216._0_8_;
        auVar225._8_8_ = auVar154._0_8_;
        auVar226 = pmaddubsw(auVar225,_DAT_00172670);
        bVar95 = in_XMM5[7];
        auVar255._0_14_ = in_XMM2._0_14_;
        auVar255[0xe] = uVar56;
        auVar255[0xf] = bVar95;
        bVar93 = in_XMM5[6];
        auVar254._14_2_ = auVar255._14_2_;
        auVar254._0_13_ = in_XMM2._0_13_;
        auVar254[0xd] = bVar93;
        auVar253._13_3_ = auVar254._13_3_;
        auVar253._0_12_ = in_XMM2._0_12_;
        auVar253[0xc] = uVar54;
        bVar92 = in_XMM5[5];
        auVar252._12_4_ = auVar253._12_4_;
        auVar252._0_11_ = in_XMM2._0_11_;
        auVar252[0xb] = bVar92;
        auVar251._11_5_ = auVar252._11_5_;
        auVar251._0_10_ = in_XMM2._0_10_;
        auVar251[10] = uVar52;
        bVar90 = in_XMM5[4];
        auVar250._10_6_ = auVar251._10_6_;
        auVar250._0_9_ = in_XMM2._0_9_;
        auVar250[9] = bVar90;
        auVar249._9_7_ = auVar250._9_7_;
        auVar249._0_8_ = in_XMM2._0_8_;
        auVar249[8] = uVar50;
        auVar248._8_8_ = auVar249._8_8_;
        auVar248[7] = in_XMM5[3];
        auVar248[6] = uVar48;
        auVar248[5] = in_XMM5[2];
        auVar248._0_4_ = in_XMM2._0_4_;
        auVar248[4] = uVar46;
        auVar247._4_12_ = auVar248._4_12_;
        auVar247[3] = in_XMM5[1];
        auVar247[2] = uVar44;
        auVar79[0] = in_XMM5[0];
        auVar247[1] = auVar79[0];
        auVar247[0] = uVar37;
        bVar77 = in_XMM4[7];
        auVar171[0xe] = uVar235;
        auVar171._0_14_ = auVar224._0_14_;
        auVar171[0xf] = bVar77;
        bVar76 = in_XMM4[6];
        auVar170._14_2_ = auVar171._14_2_;
        auVar170[0xd] = bVar76;
        auVar170._0_13_ = auVar223._0_13_;
        auVar169._13_3_ = auVar170._13_3_;
        auVar169[0xc] = uVar234;
        auVar169._0_12_ = auVar222._0_12_;
        bVar75 = in_XMM4[5];
        auVar168._12_4_ = auVar169._12_4_;
        auVar168[0xb] = bVar75;
        auVar168._0_11_ = auVar221._0_11_;
        auVar167._11_5_ = auVar168._11_5_;
        auVar167[10] = uVar233;
        auVar167._0_10_ = auVar220._0_10_;
        bVar74 = in_XMM4[4];
        auVar166._10_6_ = auVar167._10_6_;
        auVar166[9] = bVar74;
        auVar166._0_9_ = auVar219._0_9_;
        auVar165._9_7_ = auVar166._9_7_;
        auVar165[8] = uVar232;
        auVar165._0_8_ = auVar218._0_8_;
        auVar164._8_8_ = auVar165._8_8_;
        auVar164[7] = in_XMM4[3];
        auVar164[6] = uVar231;
        auVar164[5] = in_XMM4[2];
        auVar164[4] = uVar230;
        auVar164._0_4_ = auVar217._0_4_;
        auVar163._4_12_ = auVar164._4_12_;
        auVar163[3] = in_XMM4[1];
        auVar163[2] = uVar229;
        auVar163[1] = in_XMM4[0];
        auVar163[0] = auVar216[0];
        auVar172._0_8_ = auVar163._0_8_;
        auVar172._8_8_ = auVar247._0_8_;
        auVar264._0_14_ = in_XMM1._0_14_;
        auVar264[0xe] = uVar36;
        auVar264[0xf] = uVar195;
        auVar263._14_2_ = auVar264._14_2_;
        auVar263._0_13_ = in_XMM1._0_13_;
        auVar263[0xd] = uVar192;
        auVar262._13_3_ = auVar263._13_3_;
        auVar262._0_12_ = in_XMM1._0_12_;
        auVar262[0xc] = uVar35;
        auVar261._12_4_ = auVar262._12_4_;
        auVar261._0_11_ = in_XMM1._0_11_;
        auVar261[0xb] = uVar191;
        auVar260._11_5_ = auVar261._11_5_;
        auVar260._0_10_ = in_XMM1._0_10_;
        auVar260[10] = uVar34;
        auVar259._10_6_ = auVar260._10_6_;
        auVar259._0_9_ = in_XMM1._0_9_;
        auVar259[9] = uVar187;
        auVar258._9_7_ = auVar259._9_7_;
        auVar258._0_8_ = in_XMM1._0_8_;
        auVar258[8] = uVar33;
        auVar257._8_8_ = auVar258._8_8_;
        auVar257[7] = uVar186;
        auVar257[6] = uVar32;
        auVar257[5] = uVar183;
        auVar257._0_4_ = in_XMM1._0_4_;
        auVar257[4] = uVar31;
        auVar256._4_12_ = auVar257._4_12_;
        auVar256[3] = uVar182;
        auVar256[2] = uVar30;
        auVar256[1] = auVar154[0];
        auVar256[0] = uVar28;
        auVar265._0_4_ = auVar256._0_4_;
        auVar265._4_4_ = auVar257._4_4_;
        auVar265._8_4_ = auVar265._0_4_;
        auVar265._12_4_ = auVar265._4_4_;
        auVar244 = pmaddubsw(auVar265,_DAT_00172670);
        auVar153 = pmaddubsw(auVar172,_DAT_00172670);
        sVar134 = auVar153._0_2_ + auVar244._0_2_;
        sVar184 = auVar153._2_2_ + auVar244._2_2_;
        sVar188 = auVar153._4_2_ + auVar244._4_2_;
        sVar193 = auVar153._6_2_ + auVar244._6_2_;
        sVar196 = auVar153._8_2_ + auVar244._8_2_;
        sVar198 = auVar153._10_2_ + auVar244._10_2_;
        sVar200 = auVar153._12_2_ + auVar244._12_2_;
        sVar202 = auVar153._14_2_ + auVar244._14_2_;
        auVar153 = pshufb(ZEXT416((uint)(iVar16 * 2)),(undefined1  [16])0x0);
        auVar68._4_4_ = auVar155._0_4_;
        auVar68._0_4_ = auVar257._0_4_;
        auVar68._12_4_ = auVar248._0_4_;
        auVar68._8_4_ = auVar217._0_4_;
        auVar41._0_4_ = (int)((long)filter_flag_p << 0x1f) >> 0x1f;
        auVar41._4_4_ =
             (int)((uint)((ulong)((long)filter_flag_p << 0x1f) >> 0x20) |
                  (uint)(((ulong)(uint)filter_flag_q << 0x3f) >> 0x20)) >> 0x1f;
        auVar41._8_4_ = auVar41._0_4_;
        auVar41._12_4_ = auVar41._4_4_;
        auVar41 = auVar41 & auVar153;
        auVar245 = paddusb(auVar68,auVar41);
        auVar244 = psubusb(auVar68,auVar41);
        auVar274._0_14_ = in_XMM4._0_14_;
        auVar274[0xe] = bVar77;
        auVar274[0xf] = in_XMM7[7];
        auVar273._14_2_ = auVar274._14_2_;
        auVar273._0_13_ = in_XMM4._0_13_;
        auVar273[0xd] = in_XMM7[6];
        auVar272._13_3_ = auVar273._13_3_;
        auVar272._0_12_ = in_XMM4._0_12_;
        auVar272[0xc] = bVar76;
        auVar271._12_4_ = auVar272._12_4_;
        auVar271._0_11_ = in_XMM4._0_11_;
        auVar271[0xb] = in_XMM7[5];
        auVar270._11_5_ = auVar271._11_5_;
        auVar270._0_10_ = in_XMM4._0_10_;
        auVar270[10] = bVar75;
        auVar269._10_6_ = auVar270._10_6_;
        auVar269._0_9_ = in_XMM4._0_9_;
        auVar269[9] = in_XMM7[4];
        auVar268._9_7_ = auVar269._9_7_;
        auVar268._0_8_ = in_XMM4._0_8_;
        auVar268[8] = bVar74;
        auVar267._8_8_ = auVar268._8_8_;
        auVar267[7] = in_XMM7[3];
        auVar267[6] = in_XMM4[3];
        auVar267[5] = in_XMM7[2];
        auVar267._0_4_ = in_XMM4._0_4_;
        auVar267[4] = in_XMM4[2];
        auVar266._4_12_ = auVar267._4_12_;
        auVar266[3] = in_XMM7[1];
        auVar266[2] = in_XMM4[1];
        auVar266[1] = in_XMM7[0];
        auVar266[0] = in_XMM4[0];
        auVar71._8_4_ = in_XMM4._4_4_;
        auVar71._0_8_ = auVar268._0_8_;
        auVar71._12_4_ = in_XMM5._4_4_;
        auVar70._8_8_ = auVar71._8_8_;
        auVar80._0_4_ = in_XMM5._0_4_;
        auVar70._4_4_ = auVar80._0_4_;
        auVar70._0_4_ = auVar267._0_4_;
        auVar87._0_14_ = in_XMM5._0_14_;
        auVar87[0xe] = bVar95;
        auVar87[0xf] = (char)((ulong)in_XMM6_Qa >> 0x38);
        auVar86._14_2_ = auVar87._14_2_;
        auVar86._0_13_ = in_XMM5._0_13_;
        auVar86[0xd] = (char)((ulong)in_XMM6_Qa >> 0x30);
        auVar85._13_3_ = auVar86._13_3_;
        auVar85._0_12_ = in_XMM5._0_12_;
        auVar85[0xc] = bVar93;
        auVar84._12_4_ = auVar85._12_4_;
        auVar84._0_11_ = in_XMM5._0_11_;
        auVar84[0xb] = (char)((ulong)in_XMM6_Qa >> 0x28);
        auVar83._11_5_ = auVar84._11_5_;
        auVar83._0_10_ = in_XMM5._0_10_;
        auVar83[10] = bVar92;
        auVar82._10_6_ = auVar83._10_6_;
        auVar82._0_9_ = in_XMM5._0_9_;
        auVar82[9] = (char)((ulong)in_XMM6_Qa >> 0x20);
        auVar81._9_7_ = auVar82._9_7_;
        auVar81._0_8_ = in_XMM5._0_8_;
        auVar81[8] = bVar90;
        auVar80._8_8_ = auVar81._8_8_;
        auVar80[7] = (char)((ulong)in_XMM6_Qa >> 0x18);
        auVar80[6] = in_XMM5[3];
        auVar80[5] = (char)((ulong)in_XMM6_Qa >> 0x10);
        auVar80[4] = in_XMM5[2];
        auVar79._4_12_ = auVar80._4_12_;
        auVar79[3] = (char)((ulong)in_XMM6_Qa >> 8);
        auVar79[2] = in_XMM5[1];
        auVar79[1] = (char)in_XMM6_Qa;
        auVar275._0_8_ = auVar266._0_8_;
        auVar275._8_8_ = auVar79._0_8_;
        auVar276 = pmaddubsw(auVar275,_DAT_00172560);
        auVar215 = paddusb(auVar70,auVar41);
        auVar101 = psubusb(auVar70,auVar41);
        auVar125 = pmovsxbw(in_XMM7,0x202020202020202);
        sVar135 = sVar134 + 4;
        sVar185 = sVar184 + 4;
        sVar189 = sVar188 + 4;
        sVar194 = sVar193 + 4;
        sVar197 = sVar196 + 4;
        sVar199 = sVar198 + 4;
        sVar201 = sVar200 + 4;
        sVar203 = sVar202 + 4;
        auVar42._0_2_ = auVar226._8_2_ + auVar226._0_2_ + sVar135;
        auVar42._2_2_ = auVar226._10_2_ + auVar226._2_2_ + sVar185;
        auVar42._4_2_ = auVar226._12_2_ + auVar226._4_2_ + sVar189;
        auVar42._6_2_ = auVar226._14_2_ + auVar226._6_2_ + sVar194;
        auVar42._8_2_ = auVar226._0_2_ + auVar226._8_2_ + sVar197;
        auVar42._10_2_ = auVar226._2_2_ + auVar226._10_2_ + sVar199;
        auVar42._12_2_ = auVar226._4_2_ + auVar226._12_2_ + sVar201;
        auVar42._14_2_ = auVar226._6_2_ + auVar226._14_2_ + sVar203;
        auVar153 = psraw(auVar42,3);
        uVar124 = (ushort)(auVar125._0_2_ + sVar134) >> 2;
        uVar127 = (ushort)(auVar125._2_2_ + sVar184) >> 2;
        uVar128 = (ushort)(auVar125._4_2_ + sVar188) >> 2;
        uVar129 = (ushort)(auVar125._6_2_ + sVar193) >> 2;
        uVar130 = (ushort)(auVar125._8_2_ + sVar196) >> 2;
        uVar131 = (ushort)(auVar125._10_2_ + sVar198) >> 2;
        uVar132 = (ushort)(auVar125._12_2_ + sVar200) >> 2;
        uVar133 = (ushort)(auVar125._14_2_ + sVar202) >> 2;
        sVar134 = auVar153._0_2_;
        bVar7 = (0 < sVar134) * (sVar134 < 0x100) * auVar153[0] - (0xff < sVar134);
        sVar134 = auVar153._2_2_;
        bVar8 = (0 < sVar134) * (sVar134 < 0x100) * auVar153[2] - (0xff < sVar134);
        sVar134 = auVar153._4_2_;
        bVar47 = (0 < sVar134) * (sVar134 < 0x100) * auVar153[4] - (0xff < sVar134);
        sVar134 = auVar153._6_2_;
        bVar49 = (0 < sVar134) * (sVar134 < 0x100) * auVar153[6] - (0xff < sVar134);
        sVar134 = auVar153._8_2_;
        bVar51 = (0 < sVar134) * (sVar134 < 0x100) * auVar153[8] - (0xff < sVar134);
        sVar134 = auVar153._10_2_;
        bVar53 = (0 < sVar134) * (sVar134 < 0x100) * auVar153[10] - (0xff < sVar134);
        sVar134 = auVar153._12_2_;
        bVar55 = (0 < sVar134) * (sVar134 < 0x100) * auVar153[0xc] - (0xff < sVar134);
        sVar134 = auVar153._14_2_;
        bVar57 = (0 < sVar134) * (sVar134 < 0x100) * auVar153[0xe] - (0xff < sVar134);
        bVar58 = (uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124);
        bVar59 = (uVar127 != 0) * (uVar127 < 0x100) * (char)uVar127 - (0xff < uVar127);
        bVar60 = (uVar128 != 0) * (uVar128 < 0x100) * (char)uVar128 - (0xff < uVar128);
        bVar61 = (uVar129 != 0) * (uVar129 < 0x100) * (char)uVar129 - (0xff < uVar129);
        bVar62 = (uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130);
        bVar63 = (uVar131 != 0) * (uVar131 < 0x100) * (char)uVar131 - (0xff < uVar131);
        bVar9 = (uVar132 != 0) * (uVar132 < 0x100) * (char)uVar132 - (0xff < uVar132);
        bVar10 = (uVar133 != 0) * (uVar133 < 0x100) * (char)uVar133 - (0xff < uVar133);
        bVar38 = auVar245[0];
        bVar38 = (bVar38 < bVar7) * bVar38 | (bVar38 >= bVar7) * bVar7;
        bVar7 = auVar245[1];
        bVar45 = (bVar7 < bVar8) * bVar7 | (bVar7 >= bVar8) * bVar8;
        bVar8 = auVar245[2];
        bVar47 = (bVar8 < bVar47) * bVar8 | (bVar8 >= bVar47) * bVar47;
        bVar8 = auVar245[3];
        bVar49 = (bVar8 < bVar49) * bVar8 | (bVar8 >= bVar49) * bVar49;
        bVar8 = auVar245[4];
        bVar51 = (bVar8 < bVar51) * bVar8 | (bVar8 >= bVar51) * bVar51;
        bVar8 = auVar245[5];
        bVar53 = (bVar8 < bVar53) * bVar8 | (bVar8 >= bVar53) * bVar53;
        bVar8 = auVar245[6];
        bVar55 = (bVar8 < bVar55) * bVar8 | (bVar8 >= bVar55) * bVar55;
        bVar8 = auVar245[7];
        bVar57 = (bVar8 < bVar57) * bVar8 | (bVar8 >= bVar57) * bVar57;
        bVar8 = auVar245[8];
        bVar58 = (bVar8 < bVar58) * bVar8 | (bVar8 >= bVar58) * bVar58;
        bVar8 = auVar245[9];
        bVar59 = (bVar8 < bVar59) * bVar8 | (bVar8 >= bVar59) * bVar59;
        bVar8 = auVar245[10];
        bVar60 = (bVar8 < bVar60) * bVar8 | (bVar8 >= bVar60) * bVar60;
        bVar8 = auVar245[0xb];
        bVar61 = (bVar8 < bVar61) * bVar8 | (bVar8 >= bVar61) * bVar61;
        bVar8 = auVar245[0xc];
        bVar62 = (bVar8 < bVar62) * bVar8 | (bVar8 >= bVar62) * bVar62;
        bVar8 = auVar245[0xd];
        bVar63 = (bVar8 < bVar63) * bVar8 | (bVar8 >= bVar63) * bVar63;
        bVar8 = auVar245[0xe];
        bVar64 = (bVar8 < bVar9) * bVar8 | (bVar8 >= bVar9) * bVar9;
        bVar8 = auVar245[0xf];
        bVar65 = (bVar8 < bVar10) * bVar8 | (bVar8 >= bVar10) * bVar10;
        bVar8 = auVar244[0];
        bVar7 = auVar244[1];
        bVar10 = auVar244[2];
        bVar9 = auVar244[3];
        uVar39 = CONCAT13((bVar49 < bVar9) * bVar9 | (bVar49 >= bVar9) * bVar49,
                          CONCAT12((bVar47 < bVar10) * bVar10 | (bVar47 >= bVar10) * bVar47,
                                   CONCAT11((bVar45 < bVar7) * bVar7 | (bVar45 >= bVar7) * bVar45,
                                            (bVar38 < bVar8) * bVar8 | (bVar38 >= bVar8) * bVar38)))
        ;
        bVar8 = auVar244[4];
        bVar7 = auVar244[5];
        bVar10 = auVar244[6];
        bVar9 = auVar244[7];
        auVar40._0_8_ =
             CONCAT17((bVar57 < bVar9) * bVar9 | (bVar57 >= bVar9) * bVar57,
                      CONCAT16((bVar55 < bVar10) * bVar10 | (bVar55 >= bVar10) * bVar55,
                               CONCAT15((bVar53 < bVar7) * bVar7 | (bVar53 >= bVar7) * bVar53,
                                        CONCAT14((bVar51 < bVar8) * bVar8 |
                                                 (bVar51 >= bVar8) * bVar51,uVar39))));
        bVar8 = auVar244[8];
        auVar40[8] = (bVar58 < bVar8) * bVar8 | (bVar58 >= bVar8) * bVar58;
        bVar8 = auVar244[9];
        auVar40[9] = (bVar59 < bVar8) * bVar8 | (bVar59 >= bVar8) * bVar59;
        bVar8 = auVar244[10];
        auVar40[10] = (bVar60 < bVar8) * bVar8 | (bVar60 >= bVar8) * bVar60;
        bVar8 = auVar244[0xb];
        auVar40[0xb] = (bVar61 < bVar8) * bVar8 | (bVar61 >= bVar8) * bVar61;
        bVar8 = auVar244[0xc];
        auVar43[0xc] = (bVar62 < bVar8) * bVar8 | (bVar62 >= bVar8) * bVar62;
        auVar43._0_12_ = auVar40;
        bVar8 = auVar244[0xd];
        auVar43[0xd] = (bVar63 < bVar8) * bVar8 | (bVar63 >= bVar8) * bVar63;
        bVar8 = auVar244[0xe];
        auVar43[0xe] = (bVar64 < bVar8) * bVar8 | (bVar64 >= bVar8) * bVar64;
        bVar8 = auVar244[0xf];
        auVar43[0xf] = (bVar65 < bVar8) * bVar8 | (bVar65 >= bVar8) * bVar65;
        uVar124 = (ushort)(sVar135 + auVar276._0_2_) >> 3;
        uVar127 = (ushort)(sVar185 + auVar276._2_2_) >> 3;
        uVar128 = (ushort)(sVar189 + auVar276._4_2_) >> 3;
        uVar129 = (ushort)(sVar194 + auVar276._6_2_) >> 3;
        uVar130 = (ushort)(sVar197 + auVar276._8_2_) >> 3;
        uVar131 = (ushort)(sVar199 + auVar276._10_2_) >> 3;
        uVar132 = (ushort)(sVar201 + auVar276._12_2_) >> 3;
        uVar133 = (ushort)(sVar203 + auVar276._14_2_) >> 3;
        bVar8 = (uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124);
        bVar7 = (uVar127 != 0) * (uVar127 < 0x100) * (char)uVar127 - (0xff < uVar127);
        bVar10 = (uVar128 != 0) * (uVar128 < 0x100) * (char)uVar128 - (0xff < uVar128);
        bVar9 = (uVar129 != 0) * (uVar129 < 0x100) * (char)uVar129 - (0xff < uVar129);
        bVar63 = (uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130);
        bVar62 = (uVar131 != 0) * (uVar131 < 0x100) * (char)uVar131 - (0xff < uVar131);
        bVar61 = (uVar132 != 0) * (uVar132 < 0x100) * (char)uVar132 - (0xff < uVar132);
        bVar60 = (uVar133 != 0) * (uVar133 < 0x100) * (char)uVar133 - (0xff < uVar133);
        bVar59 = auVar215[0];
        bVar59 = (bVar59 < bVar8) * bVar59 | (bVar59 >= bVar8) * bVar8;
        bVar8 = auVar215[1];
        bVar57 = (bVar8 < bVar7) * bVar8 | (bVar8 >= bVar7) * bVar7;
        bVar8 = auVar215[2];
        bVar58 = (bVar8 < bVar10) * bVar8 | (bVar8 >= bVar10) * bVar10;
        bVar8 = auVar215[3];
        bVar47 = (bVar8 < bVar9) * bVar8 | (bVar8 >= bVar9) * bVar9;
        bVar8 = auVar215[4];
        bVar63 = (bVar8 < bVar63) * bVar8 | (bVar8 >= bVar63) * bVar63;
        bVar8 = auVar215[5];
        bVar62 = (bVar8 < bVar62) * bVar8 | (bVar8 >= bVar62) * bVar62;
        bVar8 = auVar215[6];
        bVar61 = (bVar8 < bVar61) * bVar8 | (bVar8 >= bVar61) * bVar61;
        bVar8 = auVar215[7];
        bVar60 = (bVar8 < bVar60) * bVar8 | (bVar8 >= bVar60) * bVar60;
        bVar8 = auVar215[8];
        bVar49 = (bVar8 < bVar74) * bVar8 | (bVar8 >= bVar74) * bVar74;
        bVar8 = auVar215[9];
        bVar53 = (bVar8 < bVar75) * bVar8 | (bVar8 >= bVar75) * bVar75;
        bVar8 = auVar215[10];
        bVar55 = (bVar8 < bVar76) * bVar8 | (bVar8 >= bVar76) * bVar76;
        bVar8 = auVar215[0xb];
        bVar51 = (bVar8 < bVar77) * bVar8 | (bVar8 >= bVar77) * bVar77;
        bVar8 = auVar215[0xc];
        bVar38 = (bVar8 < bVar90) * bVar8 | (bVar8 >= bVar90) * bVar90;
        bVar8 = auVar215[0xd];
        bVar45 = (bVar8 < bVar92) * bVar8 | (bVar8 >= bVar92) * bVar92;
        bVar8 = auVar215[0xe];
        bVar64 = (bVar8 < bVar93) * bVar8 | (bVar8 >= bVar93) * bVar93;
        bVar8 = auVar215[0xf];
        bVar65 = (bVar8 < bVar95) * bVar8 | (bVar8 >= bVar95) * bVar95;
        bVar8 = auVar101[0];
        bVar7 = auVar101[1];
        bVar10 = auVar101[2];
        bVar9 = auVar101[3];
        uVar66 = CONCAT13((bVar47 < bVar9) * bVar9 | (bVar47 >= bVar9) * bVar47,
                          CONCAT12((bVar58 < bVar10) * bVar10 | (bVar58 >= bVar10) * bVar58,
                                   CONCAT11((bVar57 < bVar7) * bVar7 | (bVar57 >= bVar7) * bVar57,
                                            (bVar59 < bVar8) * bVar8 | (bVar59 >= bVar8) * bVar59)))
        ;
        bVar8 = auVar101[4];
        bVar7 = auVar101[5];
        bVar10 = auVar101[6];
        bVar9 = auVar101[7];
        auVar67._0_8_ =
             CONCAT17((bVar60 < bVar9) * bVar9 | (bVar60 >= bVar9) * bVar60,
                      CONCAT16((bVar61 < bVar10) * bVar10 | (bVar61 >= bVar10) * bVar61,
                               CONCAT15((bVar62 < bVar7) * bVar7 | (bVar62 >= bVar7) * bVar62,
                                        CONCAT14((bVar63 < bVar8) * bVar8 |
                                                 (bVar63 >= bVar8) * bVar63,uVar66))));
        bVar8 = auVar101[8];
        auVar67[8] = (bVar49 < bVar8) * bVar8 | (bVar49 >= bVar8) * bVar49;
        bVar8 = auVar101[9];
        auVar67[9] = (bVar53 < bVar8) * bVar8 | (bVar53 >= bVar8) * bVar53;
        bVar8 = auVar101[10];
        auVar67[10] = (bVar55 < bVar8) * bVar8 | (bVar55 >= bVar8) * bVar55;
        bVar8 = auVar101[0xb];
        auVar67[0xb] = (bVar51 < bVar8) * bVar8 | (bVar51 >= bVar8) * bVar51;
        bVar8 = auVar101[0xc];
        auVar69[0xc] = (bVar38 < bVar8) * bVar8 | (bVar38 >= bVar8) * bVar38;
        auVar69._0_12_ = auVar67;
        bVar8 = auVar101[0xd];
        auVar69[0xd] = (bVar45 < bVar8) * bVar8 | (bVar45 >= bVar8) * bVar45;
        bVar8 = auVar101[0xe];
        auVar69[0xe] = (bVar64 < bVar8) * bVar8 | (bVar64 >= bVar8) * bVar64;
        bVar8 = auVar101[0xf];
        auVar69[0xf] = (bVar65 < bVar8) * bVar8 | (bVar65 >= bVar8) * bVar65;
        auVar72._8_4_ = (int)((ulong)auVar40._0_8_ >> 0x20);
        auVar72._0_8_ = auVar40._0_8_;
        auVar72._12_4_ = in_XMM3._4_4_;
        *(ulong *)(pu1_src + -(long)(src_strd * 3)) = CONCAT44(auVar67._8_4_,uVar66);
        lVar26 = (long)(src_strd * 2);
        *(ulong *)(pu1_src + -lVar26) = CONCAT44(in_XMM0._4_4_,auVar40._8_4_);
        *(ulong *)(pu1_src + -(long)src_strd) = CONCAT44(in_XMM1._4_4_,uVar39);
        *(long *)pu1_src = auVar72._8_8_;
        uVar29 = CONCAT44(in_XMM2._4_4_,auVar43._12_4_);
        uVar27 = CONCAT44(auVar69._12_4_,(int)((ulong)auVar67._0_8_ >> 0x20));
        pUVar17 = pu1_src + src_strd;
      }
      else {
        auVar126._4_4_ = iVar16;
        auVar126._0_4_ = iVar16;
        auVar126._8_4_ = iVar16;
        auVar126._12_4_ = iVar16;
        auVar110[0xe] = uVar235;
        auVar110._0_14_ = auVar224._0_14_;
        auVar110[0xf] = uVar36;
        auVar109._14_2_ = auVar110._14_2_;
        auVar109[0xd] = uVar35;
        auVar109._0_13_ = auVar223._0_13_;
        auVar108._13_3_ = auVar109._13_3_;
        auVar108[0xc] = uVar234;
        auVar108._0_12_ = auVar222._0_12_;
        auVar107._12_4_ = auVar108._12_4_;
        auVar107[0xb] = uVar34;
        auVar107._0_11_ = auVar221._0_11_;
        auVar106._11_5_ = auVar107._11_5_;
        auVar106[10] = uVar233;
        auVar106._0_10_ = auVar220._0_10_;
        auVar105._10_6_ = auVar106._10_6_;
        auVar105[9] = uVar33;
        auVar105._0_9_ = auVar219._0_9_;
        auVar104._9_7_ = auVar105._9_7_;
        auVar104[8] = uVar232;
        auVar104._0_8_ = auVar218._0_8_;
        Var12 = CONCAT91(CONCAT81(auVar104._8_8_,uVar32),uVar231);
        auVar103._6_10_ = Var12;
        auVar103[5] = uVar31;
        auVar103[4] = uVar230;
        auVar103._0_4_ = auVar217._0_4_;
        auVar13._2_12_ = auVar103._4_12_;
        auVar13[1] = uVar30;
        auVar13[0] = uVar229;
        auVar102._0_2_ = CONCAT11(uVar28,auVar216[0]);
        auVar102._2_14_ = auVar13;
        auVar181[0xe] = uVar195;
        auVar181._0_14_ = auVar162._0_14_;
        auVar181[0xf] = uVar56;
        auVar180._14_2_ = auVar181._14_2_;
        auVar180[0xd] = uVar54;
        auVar180._0_13_ = auVar161._0_13_;
        auVar179._13_3_ = auVar180._13_3_;
        auVar179[0xc] = uVar192;
        auVar179._0_12_ = auVar160._0_12_;
        auVar178._12_4_ = auVar179._12_4_;
        auVar178[0xb] = uVar52;
        auVar178._0_11_ = auVar159._0_11_;
        auVar177._11_5_ = auVar178._11_5_;
        auVar177[10] = uVar191;
        auVar177._0_10_ = auVar158._0_10_;
        auVar176._10_6_ = auVar177._10_6_;
        auVar176[9] = uVar50;
        auVar176._0_9_ = auVar157._0_9_;
        auVar175._9_7_ = auVar176._9_7_;
        auVar175[8] = uVar187;
        auVar175._0_8_ = auVar156._0_8_;
        Var15 = CONCAT91(CONCAT81(auVar175._8_8_,uVar48),uVar186);
        auVar174._6_10_ = Var15;
        auVar174[5] = uVar46;
        auVar174[4] = uVar183;
        auVar174._0_4_ = auVar155._0_4_;
        auVar14._2_12_ = auVar174._4_12_;
        auVar14[1] = uVar44;
        auVar14[0] = uVar182;
        auVar173._0_2_ = CONCAT11(uVar37,auVar154[0]);
        auVar173._2_14_ = auVar14;
        auVar114._0_12_ = auVar102._0_12_;
        auVar114._12_2_ = (short)Var12;
        auVar114._14_2_ = (short)Var15;
        auVar113._12_4_ = auVar114._12_4_;
        auVar113._0_10_ = auVar102._0_10_;
        auVar113._10_2_ = auVar174._4_2_;
        auVar112._10_6_ = auVar113._10_6_;
        auVar112._0_8_ = auVar102._0_8_;
        auVar112._8_2_ = auVar103._4_2_;
        auVar111._8_8_ = auVar112._8_8_;
        auVar111._6_2_ = auVar14._0_2_;
        auVar111._4_2_ = auVar13._0_2_;
        auVar111._2_2_ = auVar173._0_2_;
        auVar111._0_2_ = auVar102._0_2_;
        auVar244 = pmaddubsw(auVar111,(undefined1  [16])coef_de1);
        auVar153 = packssdw(auVar126,auVar126);
        auVar215 = pmovsxbw(auVar173,0xa0a0a0a0a0a0a0a);
        auVar101 = pmaddwd(auVar244,_DAT_00172640);
        sVar134 = auVar153._0_2_;
        sVar135 = auVar153._2_2_;
        sVar184 = auVar153._4_2_;
        sVar185 = auVar153._6_2_;
        sVar188 = auVar153._8_2_;
        sVar189 = auVar153._10_2_;
        sVar193 = auVar153._12_2_;
        sVar194 = auVar153._14_2_;
        auVar244 = pmaddubsw(auVar111,(undefined1  [16])coef_dep1);
        auVar227._0_4_ = auVar101._0_4_ + 8 >> 4;
        auVar227._4_4_ = auVar101._4_4_ + 8 >> 4;
        auVar227._8_4_ = auVar101._8_4_ + 8 >> 4;
        auVar227._12_4_ = auVar101._12_4_ + 8 >> 4;
        auVar246._8_4_ = 0xffffffff;
        auVar246._0_8_ = 0xffffffffffffffff;
        auVar246._12_4_ = 0xffffffff;
        auVar125 = psignd(auVar227,auVar246);
        auVar226 = psignw(auVar153,auVar246);
        auVar101 = packssdw(auVar227,auVar125);
        auVar125 = pabsw(auVar125,auVar101);
        auVar278._0_2_ = -(ushort)(auVar125._0_2_ < (short)(auVar215._0_2_ * sVar134));
        auVar278._2_2_ = -(ushort)(auVar125._2_2_ < (short)(auVar215._2_2_ * sVar135));
        auVar278._4_2_ = -(ushort)(auVar125._4_2_ < (short)(auVar215._4_2_ * sVar184));
        auVar278._6_2_ = -(ushort)(auVar125._6_2_ < (short)(auVar215._6_2_ * sVar185));
        auVar278._8_2_ = -(ushort)(auVar125._8_2_ < (short)(auVar215._8_2_ * sVar188));
        auVar278._10_2_ = -(ushort)(auVar125._10_2_ < (short)(auVar215._10_2_ * sVar189));
        auVar278._12_2_ = -(ushort)(auVar125._12_2_ < (short)(auVar215._12_2_ * sVar193));
        auVar278._14_2_ = -(ushort)(auVar125._14_2_ < (short)(auVar215._14_2_ * sVar194));
        sVar196 = auVar101._0_2_;
        uVar124 = (ushort)(sVar134 < sVar196) * sVar134 | (ushort)(sVar134 >= sVar196) * sVar196;
        sVar134 = auVar101._2_2_;
        uVar127 = (ushort)(sVar135 < sVar134) * sVar135 | (ushort)(sVar135 >= sVar134) * sVar134;
        sVar134 = auVar101._4_2_;
        uVar128 = (ushort)(sVar184 < sVar134) * sVar184 | (ushort)(sVar184 >= sVar134) * sVar134;
        sVar134 = auVar101._6_2_;
        uVar129 = (ushort)(sVar185 < sVar134) * sVar185 | (ushort)(sVar185 >= sVar134) * sVar134;
        sVar134 = auVar101._8_2_;
        uVar130 = (ushort)(sVar188 < sVar134) * sVar188 | (ushort)(sVar188 >= sVar134) * sVar134;
        sVar134 = auVar101._10_2_;
        uVar131 = (ushort)(sVar189 < sVar134) * sVar189 | (ushort)(sVar189 >= sVar134) * sVar134;
        sVar134 = auVar101._12_2_;
        sVar135 = auVar101._14_2_;
        uVar132 = (ushort)(sVar193 < sVar134) * sVar193 | (ushort)(sVar193 >= sVar134) * sVar134;
        uVar133 = (ushort)(sVar194 < sVar135) * sVar194 | (ushort)(sVar194 >= sVar135) * sVar135;
        sVar134 = auVar226._0_2_;
        auVar228._0_2_ =
             (ushort)((short)uVar124 < sVar134) * sVar134 | ((short)uVar124 >= sVar134) * uVar124;
        sVar134 = auVar226._2_2_;
        auVar228._2_2_ =
             (ushort)((short)uVar127 < sVar134) * sVar134 | ((short)uVar127 >= sVar134) * uVar127;
        sVar134 = auVar226._4_2_;
        auVar228._4_2_ =
             (ushort)((short)uVar128 < sVar134) * sVar134 | ((short)uVar128 >= sVar134) * uVar128;
        sVar134 = auVar226._6_2_;
        auVar228._6_2_ =
             (ushort)((short)uVar129 < sVar134) * sVar134 | ((short)uVar129 >= sVar134) * uVar129;
        sVar134 = auVar226._8_2_;
        auVar228._8_2_ =
             (ushort)((short)uVar130 < sVar134) * sVar134 | ((short)uVar130 >= sVar134) * uVar130;
        sVar134 = auVar226._10_2_;
        auVar228._10_2_ =
             (ushort)((short)uVar131 < sVar134) * sVar134 | ((short)uVar131 >= sVar134) * uVar131;
        sVar134 = auVar226._12_2_;
        auVar228._12_2_ =
             (ushort)((short)uVar132 < sVar134) * sVar134 | ((short)uVar132 >= sVar134) * uVar132;
        sVar134 = auVar226._14_2_;
        auVar228._14_2_ =
             (ushort)((short)uVar133 < sVar134) * sVar134 | ((short)uVar133 >= sVar134) * uVar133;
        auVar215 = psraw(auVar153,1);
        auVar101 = pmovzxbw(auVar125,in_XMM5);
        auVar153 = pmovzxbw(in_XMM5,in_XMM4);
        auVar277._0_4_ = (filter_flag_p << 0x1f) >> 0x1f;
        auVar277._4_4_ = (filter_flag_p << 0x1f) >> 0x1f;
        auVar277._8_4_ = (filter_flag_q << 0x1f) >> 0x1f;
        auVar277._12_4_ = (filter_flag_q << 0x1f) >> 0x1f;
        auVar244 = pshufb(auVar244,(undefined1  [16])shuffle1);
        auVar115._0_2_ = auVar244._0_2_ + auVar153._0_2_ + auVar228._0_2_ * 2 + 1;
        auVar115._2_2_ = auVar244._2_2_ + auVar153._2_2_ + auVar228._2_2_ * 2 + 1;
        auVar115._4_2_ = auVar244._4_2_ + auVar153._4_2_ + auVar228._4_2_ * 2 + 1;
        auVar115._6_2_ = auVar244._6_2_ + auVar153._6_2_ + auVar228._6_2_ * 2 + 1;
        auVar115._8_2_ = auVar244._8_2_ + auVar101._0_2_ + auVar228._8_2_ * 2 + 1;
        auVar115._10_2_ = auVar244._10_2_ + auVar101._2_2_ + auVar228._10_2_ * 2 + 1;
        auVar115._12_2_ = auVar244._12_2_ + auVar101._4_2_ + auVar228._12_2_ * 2 + 1;
        auVar115._14_2_ = auVar244._14_2_ + auVar101._6_2_ + auVar228._14_2_ * 2 + 1;
        auVar153 = psraw(auVar115,2);
        sVar134 = auVar215._0_2_;
        sVar135 = auVar153._0_2_;
        uVar124 = (ushort)(sVar134 < sVar135) * sVar134 | (ushort)(sVar134 >= sVar135) * sVar135;
        sVar134 = auVar215._2_2_;
        sVar135 = auVar153._2_2_;
        uVar127 = (ushort)(sVar134 < sVar135) * sVar134 | (ushort)(sVar134 >= sVar135) * sVar135;
        sVar134 = auVar215._4_2_;
        sVar135 = auVar153._4_2_;
        uVar128 = (ushort)(sVar134 < sVar135) * sVar134 | (ushort)(sVar134 >= sVar135) * sVar135;
        sVar134 = auVar215._6_2_;
        sVar135 = auVar153._6_2_;
        uVar129 = (ushort)(sVar134 < sVar135) * sVar134 | (ushort)(sVar134 >= sVar135) * sVar135;
        sVar134 = auVar215._8_2_;
        sVar135 = auVar153._8_2_;
        uVar130 = (ushort)(sVar134 < sVar135) * sVar134 | (ushort)(sVar134 >= sVar135) * sVar135;
        sVar134 = auVar215._10_2_;
        sVar135 = auVar153._10_2_;
        uVar131 = (ushort)(sVar134 < sVar135) * sVar134 | (ushort)(sVar134 >= sVar135) * sVar135;
        sVar134 = auVar215._12_2_;
        sVar135 = auVar153._12_2_;
        sVar184 = auVar153._14_2_;
        uVar132 = (ushort)(sVar134 < sVar135) * sVar134 | (ushort)(sVar134 >= sVar135) * sVar135;
        sVar134 = auVar215._14_2_;
        uVar133 = (ushort)(sVar134 < sVar184) * sVar134 | (ushort)(sVar134 >= sVar184) * sVar184;
        auVar153 = psignw(auVar215,auVar246);
        auVar73._0_4_ = (int)((uVar23 & filter_flag_p) << 0x1f) >> 0x1f;
        auVar73._4_4_ = (int)((uVar23 & filter_flag_p) << 0x1f) >> 0x1f;
        auVar73._8_4_ = (int)((uVar18 & filter_flag_q) << 0x1f) >> 0x1f;
        auVar73._12_4_ = (int)((uVar18 & filter_flag_q) << 0x1f) >> 0x1f;
        sVar134 = auVar153._0_2_;
        auVar116._0_2_ =
             (ushort)((short)uVar124 < sVar134) * sVar134 | ((short)uVar124 >= sVar134) * uVar124;
        sVar134 = auVar153._2_2_;
        auVar116._2_2_ =
             (ushort)((short)uVar127 < sVar134) * sVar134 | ((short)uVar127 >= sVar134) * uVar127;
        sVar134 = auVar153._4_2_;
        auVar116._4_2_ =
             (ushort)((short)uVar128 < sVar134) * sVar134 | ((short)uVar128 >= sVar134) * uVar128;
        sVar134 = auVar153._6_2_;
        auVar116._6_2_ =
             (ushort)((short)uVar129 < sVar134) * sVar134 | ((short)uVar129 >= sVar134) * uVar129;
        sVar134 = auVar153._8_2_;
        auVar116._8_2_ =
             (ushort)((short)uVar130 < sVar134) * sVar134 | ((short)uVar130 >= sVar134) * uVar130;
        sVar134 = auVar153._10_2_;
        auVar116._10_2_ =
             (ushort)((short)uVar131 < sVar134) * sVar134 | ((short)uVar131 >= sVar134) * uVar131;
        sVar134 = auVar153._12_2_;
        auVar116._12_2_ =
             (ushort)((short)uVar132 < sVar134) * sVar134 | ((short)uVar132 >= sVar134) * uVar132;
        sVar134 = auVar153._14_2_;
        auVar116._14_2_ =
             (ushort)((short)uVar133 < sVar134) * sVar134 | ((short)uVar133 >= sVar134) * uVar133;
        auVar215 = auVar73 & auVar278 & auVar116;
        auVar278 = auVar277 & auVar228 & auVar278;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = auVar278._0_8_;
        auVar125 = pmovzxbw(auVar116,in_XMM1);
        sVar100 = auVar125._0_2_ + auVar278._0_2_;
        sVar117 = auVar125._2_2_ + auVar278._2_2_;
        sVar118 = auVar125._4_2_ + auVar278._4_2_;
        sVar119 = auVar125._6_2_ + auVar278._6_2_;
        sVar120 = auVar125._8_2_;
        sVar121 = auVar125._10_2_;
        sVar122 = auVar125._12_2_;
        sVar123 = auVar125._14_2_;
        auVar244 = pmovzxbw(in_XMM1,in_XMM3);
        sVar196 = auVar244._0_2_ + auVar278._8_2_;
        sVar197 = auVar244._2_2_ + auVar278._10_2_;
        sVar198 = auVar244._4_2_ + auVar278._12_2_;
        sVar199 = auVar244._6_2_ + auVar278._14_2_;
        sVar200 = auVar244._8_2_;
        sVar201 = auVar244._10_2_;
        sVar202 = auVar244._12_2_;
        sVar203 = auVar244._14_2_;
        auVar101 = pmovzxbw(auVar88,in_XMM0);
        sVar78 = auVar101._0_2_ + auVar215._0_2_;
        sVar89 = auVar101._2_2_ + auVar215._2_2_;
        sVar91 = auVar101._4_2_ + auVar215._4_2_;
        sVar94 = auVar101._6_2_ + auVar215._6_2_;
        sVar96 = auVar101._8_2_;
        sVar97 = auVar101._10_2_;
        sVar98 = auVar101._12_2_;
        sVar99 = auVar101._14_2_;
        auVar153 = pmovzxbw(in_XMM0,in_XMM2);
        sVar134 = auVar153._0_2_ + auVar215._8_2_;
        sVar135 = auVar153._2_2_ + auVar215._10_2_;
        sVar184 = auVar153._4_2_ + auVar215._12_2_;
        sVar185 = auVar153._6_2_ + auVar215._14_2_;
        sVar188 = auVar153._8_2_;
        sVar189 = auVar153._10_2_;
        sVar193 = auVar153._12_2_;
        sVar194 = auVar153._14_2_;
        uVar27 = CONCAT17((0 < sVar194) * (sVar194 < 0x100) * auVar153[0xe] - (0xff < sVar194),
                          CONCAT16((0 < sVar193) * (sVar193 < 0x100) * auVar153[0xc] -
                                   (0xff < sVar193),
                                   CONCAT15((0 < sVar189) * (sVar189 < 0x100) * auVar153[10] -
                                            (0xff < sVar189),
                                            CONCAT14((0 < sVar188) * (sVar188 < 0x100) * auVar153[8]
                                                     - (0xff < sVar188),
                                                     CONCAT13((0 < sVar185) * (sVar185 < 0x100) *
                                                              (char)sVar185 - (0xff < sVar185),
                                                              CONCAT12((0 < sVar184) *
                                                                       (sVar184 < 0x100) *
                                                                       (char)sVar184 -
                                                                       (0xff < sVar184),
                                                                       CONCAT11((0 < sVar135) *
                                                                                (sVar135 < 0x100) *
                                                                                (char)sVar135 -
                                                                                (0xff < sVar135),
                                                                                (0 < sVar134) *
                                                                                (sVar134 < 0x100) *
                                                                                (char)sVar134 -
                                                                                (0xff < sVar134)))))
                                           )));
        uVar29 = CONCAT17((0 < sVar203) * (sVar203 < 0x100) * auVar244[0xe] - (0xff < sVar203),
                          CONCAT16((0 < sVar202) * (sVar202 < 0x100) * auVar244[0xc] -
                                   (0xff < sVar202),
                                   CONCAT15((0 < sVar201) * (sVar201 < 0x100) * auVar244[10] -
                                            (0xff < sVar201),
                                            CONCAT14((0 < sVar200) * (sVar200 < 0x100) * auVar244[8]
                                                     - (0xff < sVar200),
                                                     CONCAT13((0 < sVar199) * (sVar199 < 0x100) *
                                                              (char)sVar199 - (0xff < sVar199),
                                                              CONCAT12((0 < sVar198) *
                                                                       (sVar198 < 0x100) *
                                                                       (char)sVar198 -
                                                                       (0xff < sVar198),
                                                                       CONCAT11((0 < sVar197) *
                                                                                (sVar197 < 0x100) *
                                                                                (char)sVar197 -
                                                                                (0xff < sVar197),
                                                                                (0 < sVar196) *
                                                                                (sVar196 < 0x100) *
                                                                                (char)sVar196 -
                                                                                (0xff < sVar196)))))
                                           )));
        *(ulong *)(pu1_src + -(long)(src_strd * 2)) =
             CONCAT17((0 < sVar99) * (sVar99 < 0x100) * auVar101[0xe] - (0xff < sVar99),
                      CONCAT16((0 < sVar98) * (sVar98 < 0x100) * auVar101[0xc] - (0xff < sVar98),
                               CONCAT15((0 < sVar97) * (sVar97 < 0x100) * auVar101[10] -
                                        (0xff < sVar97),
                                        CONCAT14((0 < sVar96) * (sVar96 < 0x100) * auVar101[8] -
                                                 (0xff < sVar96),
                                                 CONCAT13((0 < sVar94) * (sVar94 < 0x100) *
                                                          (char)sVar94 - (0xff < sVar94),
                                                          CONCAT12((0 < sVar91) * (sVar91 < 0x100) *
                                                                   (char)sVar91 - (0xff < sVar91),
                                                                   CONCAT11((0 < sVar89) *
                                                                            (sVar89 < 0x100) *
                                                                            (char)sVar89 -
                                                                            (0xff < sVar89),
                                                                            (0 < sVar78) *
                                                                            (sVar78 < 0x100) *
                                                                            (char)sVar78 -
                                                                            (0xff < sVar78))))))));
        lVar26 = (long)src_strd;
        *(ulong *)(pu1_src + -lVar26) =
             CONCAT17((0 < sVar123) * (sVar123 < 0x100) * auVar125[0xe] - (0xff < sVar123),
                      CONCAT16((0 < sVar122) * (sVar122 < 0x100) * auVar125[0xc] - (0xff < sVar122),
                               CONCAT15((0 < sVar121) * (sVar121 < 0x100) * auVar125[10] -
                                        (0xff < sVar121),
                                        CONCAT14((0 < sVar120) * (sVar120 < 0x100) * auVar125[8] -
                                                 (0xff < sVar120),
                                                 CONCAT13((0 < sVar119) * (sVar119 < 0x100) *
                                                          (char)sVar119 - (0xff < sVar119),
                                                          CONCAT12((0 < sVar118) * (sVar118 < 0x100)
                                                                   * (char)sVar118 -
                                                                   (0xff < sVar118),
                                                                   CONCAT11((0 < sVar117) *
                                                                            (sVar117 < 0x100) *
                                                                            (char)sVar117 -
                                                                            (0xff < sVar117),
                                                                            (0 < sVar100) *
                                                                            (sVar100 < 0x100) *
                                                                            (char)sVar100 -
                                                                            (0xff < sVar100))))))));
        pUVar17 = pu1_src;
      }
      *(undefined8 *)pUVar17 = uVar29;
      *(undefined8 *)(pu1_src + lVar26) = uVar27;
    }
    return;
  }
  __assert_fail("(filter_flag_p || filter_flag_q)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_deblk_ssse3_intr.c"
                ,0x236,
                "void ihevc_deblk_luma_horz_ssse3(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_deblk_luma_horz_ssse3(UWORD8 *pu1_src,
                                 WORD32 src_strd,
                                 WORD32 bs,
                                 WORD32 quant_param_p,
                                 WORD32 quant_param_q,
                                 WORD32 beta_offset_div2,
                                 WORD32 tc_offset_div2,
                                 WORD32 filter_flag_p,
                                 WORD32 filter_flag_q)
{
    WORD32 qp_luma, beta_indx, tc_indx;
    WORD32 beta, tc;

    WORD32 d0, d3, dp, dq, d;
    WORD32 de_0, de_1, de_2, de_3;
    WORD32 d_sam0, d_sam3;
    WORD32 de, dep, deq;

    __m128i src_q0_8x16b, src_q1_8x16b, src_p0_8x16b, src_p1_8x16b, src_q2_8x16b;
    __m128i tmp_pq_str1_8x16b, src_p2_8x16b, tmp_pq_str0_8x16b;




    {
        __m128i src_tmp_p_0_8x16b, src_tmp_p_1_8x16b, src_tmp_q_0_8x16b, src_tmp_q_1_8x16b;
        __m128i coef_8x16b, mask_d_result_4x32b, mask_de_result_8x16b;
        __m128i mask_16x8b, temp_coef0_8x16b, temp_coef1_8x16b;

        ASSERT((bs > 0));
        ASSERT(filter_flag_p || filter_flag_q);

        qp_luma = (quant_param_p + quant_param_q + 1) >> 1;
        beta_indx = CLIP3(qp_luma + (beta_offset_div2 << 1), 0, 51);

        /* BS based on implementation can take value 3 if it is intra/inter egde          */
        /* based on BS, tc index is calcuated by adding 2 * ( bs - 1) to QP and tc_offset */
        /* for BS = 1 adding factor is (0*2), BS = 2 or 3 adding factor is (1*2)          */
        /* the above desired functionallity is achieved by doing (2*(bs>>1))              */

        tc_indx = CLIP3(qp_luma + 2 * (bs >> 1) + (tc_offset_div2 << 1), 0, 53);

        beta = gai4_ihevc_beta_table[beta_indx];
        tc = gai4_ihevc_tc_table[tc_indx];
        if(0 == tc)
        {
            return;
        }
        src_q0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src));
        src_q1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));
        src_p0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - src_strd));
        src_p1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 2 * src_strd));
        src_q2_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd));
        tmp_pq_str1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd));
        src_p2_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 3 * src_strd));
        tmp_pq_str0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 4 * src_strd));


        src_tmp_p_0_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
        src_tmp_p_1_8x16b = _mm_unpacklo_epi8(tmp_pq_str0_8x16b, src_p2_8x16b);

        src_tmp_q_0_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
        src_tmp_q_1_8x16b = _mm_unpacklo_epi8(src_q2_8x16b, tmp_pq_str1_8x16b);

        src_tmp_p_0_8x16b = _mm_unpacklo_epi16(src_tmp_p_1_8x16b, src_tmp_p_0_8x16b);
        src_tmp_q_0_8x16b = _mm_unpacklo_epi16(src_tmp_q_0_8x16b, src_tmp_q_1_8x16b);

        src_tmp_p_0_8x16b = _mm_shuffle_epi32(src_tmp_p_0_8x16b, 0x6c);
        src_tmp_q_0_8x16b = _mm_shuffle_epi32(src_tmp_q_0_8x16b, 0x6c);

        coef_8x16b = _mm_load_si128((__m128i *)(coef_d));
        mask_16x8b =  _mm_load_si128((__m128i *)(shuffle_d));

        src_tmp_p_0_8x16b = _mm_unpacklo_epi32(src_tmp_p_0_8x16b, src_tmp_q_0_8x16b);
        //WORD32 shuffle_d[4]={0x80800403,0x80800c0b,0x03000704,0x0b080f0c};
        mask_de_result_8x16b = _mm_shuffle_epi8(src_tmp_p_0_8x16b, mask_16x8b);

        mask_d_result_4x32b = _mm_maddubs_epi16(src_tmp_p_0_8x16b, coef_8x16b);


        //to get all 1's of 8 bit in (1)
        temp_coef0_8x16b = _mm_cmpeq_epi16(src_tmp_p_0_8x16b, src_tmp_p_0_8x16b);
        temp_coef1_8x16b = _mm_srli_epi16(temp_coef0_8x16b, 15);
        //accumulating values foe dp3 dq3 , dp0 dq0 values
        mask_d_result_4x32b = _mm_madd_epi16(mask_d_result_4x32b, temp_coef1_8x16b);

        temp_coef1_8x16b = _mm_packus_epi16(temp_coef1_8x16b, temp_coef1_8x16b);
        // to get all 1,-1 sets of 16 bits in (0)
        temp_coef0_8x16b = _mm_unpacklo_epi8(temp_coef0_8x16b, temp_coef1_8x16b);
        //q33-q30,p33-p30,q03-q00,p03-p00,0,q30-p30,0,q00-p00
        mask_de_result_8x16b = _mm_maddubs_epi16(mask_de_result_8x16b, temp_coef0_8x16b);
        //to get 16 bit 1's
        temp_coef0_8x16b = _mm_srli_epi16(temp_coef1_8x16b, 8);


        // dq3 dp3 dq0 dp0
        mask_d_result_4x32b = _mm_abs_epi32(mask_d_result_4x32b);
        mask_16x8b = _mm_shuffle_epi32(mask_d_result_4x32b, 0xec);
        mask_d_result_4x32b = _mm_shuffle_epi32(mask_d_result_4x32b, 0x49);
        // dq dp d3 d0
        mask_d_result_4x32b = _mm_add_epi32(mask_d_result_4x32b, mask_16x8b);
        //|q33-q30|,|p33-p30|,|q03-q00|,|p03-p00|,0,|q30-p30|,0,|q00-p00|
        mask_de_result_8x16b = _mm_abs_epi16(mask_de_result_8x16b);
        //|q33-q30|+|p33-p30|,|q03-q00|+|p03-p00|,0+|q30-p30|,0+|q00-p00|
        mask_de_result_8x16b = _mm_madd_epi16(mask_de_result_8x16b, temp_coef0_8x16b);

        ///store back in a single variable
        temp_coef0_8x16b = _mm_srli_si128(mask_d_result_4x32b, 4);
        temp_coef1_8x16b = _mm_srli_si128(mask_d_result_4x32b, 8);
        mask_16x8b = _mm_srli_si128(mask_d_result_4x32b, 12);

        d0 = _mm_cvtsi128_si32(mask_d_result_4x32b);
        d3 = _mm_cvtsi128_si32(temp_coef0_8x16b);
        dp = _mm_cvtsi128_si32(temp_coef1_8x16b);
        dq = _mm_cvtsi128_si32(mask_16x8b);
        //getting d
        d = d0 + d3;

        ///store back in a single variable
        temp_coef0_8x16b = _mm_srli_si128(mask_de_result_8x16b, 4);
        temp_coef1_8x16b = _mm_srli_si128(mask_de_result_8x16b, 8);
        mask_16x8b = _mm_srli_si128(mask_de_result_8x16b, 12);

        de_0 = _mm_cvtsi128_si32(mask_de_result_8x16b);
        de_1 = _mm_cvtsi128_si32(temp_coef0_8x16b);
        de_2 = _mm_cvtsi128_si32(temp_coef1_8x16b);
        de_3 = _mm_cvtsi128_si32(mask_16x8b);

        de = 0;
        dep = 0;
        deq = 0;
        if(d < beta)
        {
            d_sam0 = 0;
            if((2 * d0 < (beta >> 2))
                            && (de_2 < (beta >> 3))
                            && (de_0 < ((5 * tc + 1) >> 1)))
            {
                d_sam0 = 1;
            }

            d_sam3 = 0;
            if((2 * d3 < (beta >> 2))
                            && (de_3 < (beta >> 3))
                            && de_1 < ((5 * tc + 1) >> 1))
            {
                d_sam3 = 1;
            }

            de = (d_sam0 & d_sam3) + 1;
            dep = (dp < (beta + (beta >> 1)) >> 3) ? 1 : 0;
            deq = (dq < (beta + (beta >> 1)) >> 3) ? 1 : 0;
            if(tc <= 1)
            {
                dep = 0;
                deq = 0;
            }
        }

    }

    if(de != 0)
    {

        if(2 == de)
        {

            __m128i temp_pq0_str0_16x8b;
            __m128i temp_pq1_str0_16x8b, temp_pq1_str1_16x8b;
            __m128i temp_pq2_str0_16x8b;
            __m128i temp_str0_16x8b, temp_str1_16x8b;
            __m128i const2_8x16b, const2tc_8x16b;

            LWORD64 mask, tc2;
            tc = tc << 1;
            mask = (((LWORD64)filter_flag_q) << 63) | (((LWORD64)filter_flag_p) << 31);
            tc2 = ((LWORD64)tc);

            const2_8x16b = _mm_cmpeq_epi16(src_p1_8x16b, src_p1_8x16b);
            //q'0-q'1-2 ,p'0-p'1-2
            temp_pq0_str0_16x8b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
            temp_str0_16x8b   = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
            const2_8x16b = _mm_srli_epi16(const2_8x16b, 15);
            //arranged q31 q30 q21 q20 q1 q10 q01 q00 p30 p31 p20 p21 p10 p11 p00 p01
            temp_pq0_str0_16x8b = _mm_unpacklo_epi64(temp_pq0_str0_16x8b, temp_str0_16x8b);

            const2_8x16b = _mm_packus_epi16(const2_8x16b, const2_8x16b);
            temp_pq0_str0_16x8b = _mm_maddubs_epi16(temp_pq0_str0_16x8b, const2_8x16b);

            //q'1-2, p'1-2
            temp_pq1_str0_16x8b = _mm_unpacklo_epi8(src_p0_8x16b, src_q0_8x16b);
            temp_pq1_str1_16x8b = _mm_unpacklo_epi8(src_q1_8x16b, src_q2_8x16b);
            temp_str1_16x8b = _mm_unpacklo_epi8(src_p1_8x16b, src_p2_8x16b);
            // q30 p30 q20 p20 q10 p10 q01 q00 p30 q20 p20 q10 p10 q01 q00 p00
            temp_pq1_str0_16x8b = _mm_unpacklo_epi64(temp_pq1_str0_16x8b, temp_pq1_str0_16x8b);
            // q32 q31 q22 q21 q12 q11 q02 q01 p32 p31 p22 p21 p12 p11 p02 p01
            temp_pq1_str1_16x8b = _mm_unpacklo_epi64(temp_str1_16x8b, temp_pq1_str1_16x8b);

            temp_pq1_str0_16x8b = _mm_maddubs_epi16(temp_pq1_str0_16x8b, const2_8x16b);
            temp_pq1_str1_16x8b = _mm_maddubs_epi16(temp_pq1_str1_16x8b, const2_8x16b);

            //clipping mask design
            temp_str1_16x8b = _mm_setzero_si128();
            temp_str0_16x8b = _mm_loadl_epi64((__m128i *)(&mask));
            const2tc_8x16b  = _mm_loadl_epi64((__m128i *)(&tc2));
            temp_str0_16x8b = _mm_shuffle_epi32(temp_str0_16x8b, 0x44);
            const2tc_8x16b  = _mm_shuffle_epi8(const2tc_8x16b, temp_str1_16x8b);

            //clipping mask design
            temp_str0_16x8b = _mm_srai_epi32(temp_str0_16x8b, 31);
            const2tc_8x16b = _mm_and_si128(const2tc_8x16b, temp_str0_16x8b);
            //calculating Clipping MAX for all pixel values.
            src_p0_8x16b = _mm_unpacklo_epi32(src_p0_8x16b, src_q0_8x16b);
            src_q0_8x16b = _mm_unpacklo_epi32(src_p1_8x16b, src_q1_8x16b);
            //for clipping calc
            src_p1_8x16b = _mm_unpacklo_epi64(src_p0_8x16b, src_q0_8x16b);
            //saving the unmodified data of q1 p1 q0 p0
            src_q1_8x16b = _mm_unpackhi_epi64(src_p0_8x16b, src_q0_8x16b);
            //CLIpping MAX and MIN for q1 p1 q0 p0
            src_p0_8x16b = _mm_adds_epu8(src_p1_8x16b, const2tc_8x16b);
            src_p1_8x16b = _mm_subs_epu8(src_p1_8x16b, const2tc_8x16b);


            //q'2-q'0-2,p'2-p'0-2
            tmp_pq_str0_8x16b = _mm_unpacklo_epi8(src_p2_8x16b, tmp_pq_str0_8x16b);
            temp_pq2_str0_16x8b = _mm_unpacklo_epi8(src_q2_8x16b, tmp_pq_str1_8x16b);
            const2_8x16b = _mm_slli_epi16(const2_8x16b, 1);
            //arranged q33 q32 q23 q22 q13 q12 q03 q02 p32 p33 p22 p23 p12 p13 p02 p03
            temp_pq2_str0_16x8b = _mm_unpacklo_epi64(tmp_pq_str0_8x16b, temp_pq2_str0_16x8b);
            src_p2_8x16b = _mm_unpacklo_epi32(src_p2_8x16b, src_q2_8x16b);
            temp_pq2_str0_16x8b = _mm_maddubs_epi16(temp_pq2_str0_16x8b, const2_8x16b);

            //calculating Clipping MAX and MIN for p2 and q2 .
            tmp_pq_str0_8x16b = _mm_adds_epu8(src_p2_8x16b, const2tc_8x16b);
            tmp_pq_str1_8x16b = _mm_subs_epu8(src_p2_8x16b, const2tc_8x16b);
            //q'0-q'1-2 ,p'0-p'1-2
            temp_str0_16x8b = _mm_shuffle_epi32(temp_pq0_str0_16x8b, 0x4e);
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq0_str0_16x8b, temp_str0_16x8b);
            //q'1-2 p'1-2
            temp_pq1_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq1_str1_16x8b);
            //to get 2 in 16 bit
            const2_8x16b = _mm_srli_epi16(const2_8x16b, 8);


            //q'1, p'1 (adding 2)
            temp_pq1_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, const2_8x16b);
            //q'0-q'1,p'0-p'1
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq0_str0_16x8b, const2_8x16b);
            //q'2-q'1,p'2-p'1
            temp_pq2_str0_16x8b = _mm_add_epi16(temp_pq2_str0_16x8b, const2_8x16b);
            //q'0 = (q'0-q'1)+q'1 ,p'0 = (p'0-p'1)+p'1;
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq0_str0_16x8b);
            //q'2 = (q'2-q'1)+q'1 ,p'2 = (p'2-p'1)+p'1;
            temp_pq2_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq2_str0_16x8b);

            //normalisation of all modified pixels
            temp_pq0_str0_16x8b = _mm_srai_epi16(temp_pq0_str0_16x8b, 3);
            temp_pq1_str0_16x8b = _mm_srai_epi16(temp_pq1_str0_16x8b, 2);
            temp_pq2_str0_16x8b = _mm_srai_epi16(temp_pq2_str0_16x8b, 3);
            //q'1 p'1 q'0 p'0
            temp_pq0_str0_16x8b = _mm_packus_epi16(temp_pq0_str0_16x8b, temp_pq1_str0_16x8b);
            temp_pq2_str0_16x8b = _mm_packus_epi16(temp_pq2_str0_16x8b, temp_pq2_str0_16x8b);
            //pack with the unmodified data of q2 and p2
            src_p2_8x16b = _mm_unpackhi_epi64(temp_pq2_str0_16x8b, src_p2_8x16b);
            //Clipping MAX and MIN for q'1 p'1 q'0 p'0 and q'2  p'2
            temp_pq0_str0_16x8b = _mm_min_epu8(temp_pq0_str0_16x8b, src_p0_8x16b);
            src_p2_8x16b = _mm_min_epu8(src_p2_8x16b, tmp_pq_str0_8x16b);
            temp_pq0_str0_16x8b = _mm_max_epu8(temp_pq0_str0_16x8b, src_p1_8x16b);
            src_p2_8x16b = _mm_max_epu8(src_p2_8x16b, tmp_pq_str1_8x16b);
            //Reshuffling q'1 p'1 q'0 p'0 along with unmodified data
            src_p0_8x16b = _mm_unpacklo_epi32(temp_pq0_str0_16x8b, src_q1_8x16b);
            src_p1_8x16b = _mm_unpackhi_epi32(temp_pq0_str0_16x8b, src_q1_8x16b);
            src_p2_8x16b = _mm_shuffle_epi32(src_p2_8x16b, 0xd8);
            src_q0_8x16b = _mm_srli_si128(src_p0_8x16b, 8);
            src_q1_8x16b = _mm_srli_si128(src_p1_8x16b, 8);
            src_q2_8x16b = _mm_srli_si128(src_p2_8x16b, 8);

            _mm_storel_epi64((__m128i *)(pu1_src - 3 * src_strd), src_p2_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - 2 * src_strd), src_p1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - src_strd), src_p0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src), src_q0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + src_strd), src_q1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + 2 * src_strd), src_q2_8x16b);


        }

        else
        {

            __m128i tmp_delta0_8x16b, tmp_delta1_8x16b;
            __m128i tmp0_const_8x16b, tmp1_const_8x16b, tmp2_const_8x16b;
            __m128i coefdelta_0_8x16b;
            __m128i const2_8x16b, consttc_8x16b;

            LWORD64 maskp0, maskp1, maskq0, maskq1;
            maskp0 = (LWORD64)filter_flag_p;
            maskq0 = (LWORD64)filter_flag_q;
            maskp1 = (LWORD64)dep;
            maskq1 = (LWORD64)deq;
            consttc_8x16b = _mm_set1_epi32(tc);

            tmp_delta0_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
            tmp_delta1_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
            //arranged q31 q30 p30 p31  q21 q20 p20 p21  q1 q10 p10 p11 q01 q00 p00 p01
            tmp_delta1_8x16b = _mm_unpacklo_epi16(tmp_delta0_8x16b, tmp_delta1_8x16b);

            coefdelta_0_8x16b = _mm_load_si128((__m128i *)coef_de1);
            // (-3q1+9q0),(-9p0+3p1)
            tmp_delta0_8x16b = _mm_maddubs_epi16(tmp_delta1_8x16b, coefdelta_0_8x16b);

            //getting -tc store
            tmp2_const_8x16b = _mm_cmpeq_epi32(consttc_8x16b, consttc_8x16b);

            //getting tc in 16 bit
            consttc_8x16b = _mm_packs_epi32(consttc_8x16b, consttc_8x16b);
            //calc 10 *tc = 2*tc +8*tc ; 2*tc
            tmp_pq_str0_8x16b = _mm_slli_epi16(consttc_8x16b, 1);
            //calc 10 *tc = 2*tc +8*tc ; 8*tc
            tmp_pq_str1_8x16b = _mm_slli_epi16(consttc_8x16b, 3);

            //const 1
            const2_8x16b = _mm_srli_epi16(tmp2_const_8x16b, 15);
            //calc 10 *tc
            tmp_pq_str0_8x16b = _mm_add_epi16(tmp_pq_str0_8x16b, tmp_pq_str1_8x16b);
            //delta0 without normalisation and clipping
            tmp_delta0_8x16b = _mm_madd_epi16(tmp_delta0_8x16b, const2_8x16b);

            const2_8x16b = _mm_srli_epi32(tmp2_const_8x16b, 31);

            //loaded coef for delta1 calculation
            coefdelta_0_8x16b = _mm_load_si128((__m128i *)coef_dep1);
            //(-2q1+q0),(p0-2p1)
            tmp_delta1_8x16b = _mm_maddubs_epi16(tmp_delta1_8x16b, coefdelta_0_8x16b);
            //const 8
            const2_8x16b = _mm_slli_epi32(const2_8x16b, 3);

            //normalisation of the filter
            tmp_delta0_8x16b = _mm_add_epi32(tmp_delta0_8x16b, const2_8x16b);
            tmp_delta0_8x16b = _mm_srai_epi32(tmp_delta0_8x16b, 4);

            //getting deltaq0
            tmp_pq_str1_8x16b = _mm_sign_epi32(tmp_delta0_8x16b, tmp2_const_8x16b);
            //getting -tc
            tmp1_const_8x16b = _mm_sign_epi16(consttc_8x16b, tmp2_const_8x16b);
            //packing  d03q d02q d01q d0q d03p d02p d01p d00p
            tmp_delta0_8x16b = _mm_packs_epi32(tmp_delta0_8x16b, tmp_pq_str1_8x16b);
            //absolute delta
            tmp_pq_str1_8x16b = _mm_abs_epi16(tmp_delta0_8x16b);

            //Clipping of delta0
            tmp_delta0_8x16b = _mm_min_epi16(tmp_delta0_8x16b, consttc_8x16b);
            //tc>>1 16 bit
            consttc_8x16b = _mm_srai_epi16(consttc_8x16b, 1);
            //Clipping of delta0
            tmp_delta0_8x16b = _mm_max_epi16(tmp_delta0_8x16b, tmp1_const_8x16b);

            //(-tc)>>1 16 bit
            tmp1_const_8x16b = _mm_sign_epi16(consttc_8x16b, tmp2_const_8x16b);
            //mask for |delta| < 10*tc
            tmp_pq_str0_8x16b = _mm_cmpgt_epi16(tmp_pq_str0_8x16b, tmp_pq_str1_8x16b);
            //delta 1 calc starts

            //getting q32 q22 q12 q02 p32 p12 p22 p02
            tmp0_const_8x16b = _mm_setzero_si128();
            src_q2_8x16b = _mm_unpacklo_epi8(src_q2_8x16b, tmp0_const_8x16b);
            src_p2_8x16b = _mm_unpacklo_epi8(src_p2_8x16b, tmp0_const_8x16b);
            src_p2_8x16b = _mm_unpacklo_epi64(src_p2_8x16b, src_q2_8x16b);
            //constant 1
            const2_8x16b = _mm_srli_epi16(tmp2_const_8x16b, 15);
            //2*delta0
            tmp2_const_8x16b = _mm_add_epi16(tmp_delta0_8x16b, tmp_delta0_8x16b);
            //getting  all respective q's and p's together
            coefdelta_0_8x16b = _mm_load_si128((__m128i *)(shuffle1));
            tmp_delta1_8x16b = _mm_shuffle_epi8(tmp_delta1_8x16b, coefdelta_0_8x16b);
            //final adds for deltap1 and deltaq1
            tmp_delta1_8x16b = _mm_add_epi16(tmp_delta1_8x16b, const2_8x16b);
            src_p2_8x16b = _mm_add_epi16(src_p2_8x16b, tmp2_const_8x16b);
            tmp_delta1_8x16b = _mm_add_epi16(tmp_delta1_8x16b, src_p2_8x16b);
            tmp_delta1_8x16b = _mm_srai_epi16(tmp_delta1_8x16b, 2);

            //mask0= (((LWORD64)filter_flag_q)<<63)| (((LWORD64)filter_flag_p)<<31);
            tmp_pq_str1_8x16b = _mm_loadl_epi64((__m128i *)(&(maskq0)));
            src_p2_8x16b = _mm_loadl_epi64((__m128i *)(&(maskp0)));

            //   src_p2_8x16b = _mm_set_epi32(filter_flag_q,filter_flag_p,filter_flag_q,filter_flag_p);
            //mask1= (((LWORD64)(filter_flag_q&deq))<<63)|(((LWORD64)(filter_flag_p & dep))<<31);
            src_q2_8x16b = _mm_loadl_epi64((__m128i *)(&(maskq1)));
            coefdelta_0_8x16b = _mm_loadl_epi64((__m128i *)(&(maskp1)));

            src_p2_8x16b = _mm_unpacklo_epi32(src_p2_8x16b, tmp_pq_str1_8x16b);
            src_q2_8x16b = _mm_unpacklo_epi32(coefdelta_0_8x16b, src_q2_8x16b);
            //src_q2_8x16b = _mm_set_epi32(deq,dep,deq,dep);
            src_q2_8x16b = _mm_and_si128(src_q2_8x16b, src_p2_8x16b);

            //rearranging the mask values
            src_q2_8x16b = _mm_shuffle_epi32(src_q2_8x16b, 0x50);
            src_p2_8x16b = _mm_shuffle_epi32(src_p2_8x16b, 0x50);

            src_q2_8x16b = _mm_slli_epi32(src_q2_8x16b, 31);
            src_p2_8x16b = _mm_slli_epi32(src_p2_8x16b, 31);
            src_q2_8x16b = _mm_srai_epi32(src_q2_8x16b, 31);
            src_p2_8x16b = _mm_srai_epi32(src_p2_8x16b, 31);

            //combining mask delta1
            tmp_pq_str1_8x16b = _mm_and_si128(tmp_pq_str0_8x16b, src_q2_8x16b);
            // clipping delta1
            tmp_delta1_8x16b = _mm_min_epi16(tmp_delta1_8x16b, consttc_8x16b);
            //combining mask delat0
            tmp_pq_str0_8x16b = _mm_and_si128(tmp_pq_str0_8x16b, src_p2_8x16b);
            // clipping delta1
            tmp_delta1_8x16b = _mm_max_epi16(tmp_delta1_8x16b, tmp1_const_8x16b);


            //masking of the delta values |delta|<10*tc
            tmp_delta1_8x16b = _mm_and_si128(tmp_delta1_8x16b, tmp_pq_str1_8x16b);
            tmp_delta0_8x16b = _mm_and_si128(tmp_delta0_8x16b, tmp_pq_str0_8x16b);
            //separating p and q delta 0 and addinq p0 and q0
            tmp_pq_str0_8x16b = _mm_unpacklo_epi64(tmp_delta0_8x16b, tmp0_const_8x16b);
            tmp_pq_str1_8x16b = _mm_unpackhi_epi64(tmp_delta0_8x16b, tmp0_const_8x16b);
            src_p0_8x16b = _mm_unpacklo_epi8(src_p0_8x16b, tmp0_const_8x16b);
            src_q0_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, tmp0_const_8x16b);
            src_p0_8x16b = _mm_add_epi16(src_p0_8x16b, tmp_pq_str0_8x16b);
            src_q0_8x16b = _mm_add_epi16(src_q0_8x16b, tmp_pq_str1_8x16b);
            //separating p and q delta 0 and addinq p0 and q0
            tmp_pq_str0_8x16b = _mm_unpacklo_epi64(tmp_delta1_8x16b, tmp0_const_8x16b);
            tmp_pq_str1_8x16b = _mm_unpackhi_epi64(tmp_delta1_8x16b, tmp0_const_8x16b);
            src_p1_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, tmp0_const_8x16b);
            src_q1_8x16b = _mm_unpacklo_epi8(src_q1_8x16b, tmp0_const_8x16b);
            src_p1_8x16b = _mm_add_epi16(src_p1_8x16b, tmp_pq_str0_8x16b);
            src_q1_8x16b = _mm_add_epi16(src_q1_8x16b, tmp_pq_str1_8x16b);
            //packing p1 q1 and p0 q0 to 8 bit
            src_p1_8x16b = _mm_packus_epi16(src_p1_8x16b, src_q1_8x16b);
            src_p0_8x16b = _mm_packus_epi16(src_p0_8x16b, src_q0_8x16b);

            src_q1_8x16b = _mm_srli_si128(src_p1_8x16b, 8);
            src_q0_8x16b = _mm_srli_si128(src_p0_8x16b, 8);

            _mm_storel_epi64((__m128i *)(pu1_src - 2 * src_strd), src_p1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - src_strd), src_p0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src), src_q0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + src_strd), src_q1_8x16b);


        }



    }

}